

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayImpDirWrapper.cpp
# Opt level: O0

addr_type __thiscall
DelayImpEntryWrapper::containsAddrType(DelayImpEntryWrapper *this,size_t fieldId,size_t subField)

{
  uint64_t offset_00;
  uint64_t offset;
  size_t sStack_28;
  bool isOk;
  size_t subField_local;
  size_t fieldId_local;
  DelayImpEntryWrapper *this_local;
  
  if (fieldId - 1 < 6) {
    offset._7_1_ = 0;
    sStack_28 = subField;
    subField_local = fieldId;
    fieldId_local = (size_t)this;
    offset_00 = ExeElementWrapper::getNumValue
                          ((ExeElementWrapper *)this,fieldId,(bool *)((long)&offset + 7));
    if ((offset._7_1_ & 1) == 0) {
      this_local._4_4_ = NOT_ADDR;
    }
    else {
      this_local._4_4_ =
           Executable::detectAddrType
                     ((this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                      super_ExeElementWrapper.m_Exe,offset_00,RVA);
    }
  }
  else {
    this_local._4_4_ = NOT_ADDR;
  }
  return this_local._4_4_;
}

Assistant:

Executable::addr_type DelayImpEntryWrapper::containsAddrType(size_t fieldId, size_t subField)
{
    switch (fieldId) {
        case NAME :
        case MOD :
        case IAT :
        case INT :
        case BOUND_IAT :
        case UNLOAD_IAT :
        {
            bool isOk = false;
            uint64_t offset = this->getNumValue(fieldId, &isOk);
            if (!isOk) return Executable::NOT_ADDR;

            return m_Exe->detectAddrType(offset, Executable::RVA);
        }
    }
    return Executable::NOT_ADDR;
}